

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::swap(Value *this,Value *other)

{
  long in_RSI;
  Value *in_RDI;
  Value *unaff_retaddr;
  
  swapPayload(unaff_retaddr,in_RDI);
  std::swap<Json::Value::CommentInfo*>(&in_RDI->comments_,(CommentInfo **)(in_RSI + 0x10));
  std::swap<unsigned_long>(&in_RDI->start_,(unsigned_long *)(in_RSI + 0x18));
  std::swap<unsigned_long>(&in_RDI->limit_,(unsigned_long *)(in_RSI + 0x20));
  return;
}

Assistant:

void Value::swap(Value& other) {
  swapPayload(other);
  std::swap(comments_, other.comments_);
  std::swap(start_, other.start_);
  std::swap(limit_, other.limit_);
}